

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O1

StatusOr<google::protobuf::FeatureSetDefaults> * __thiscall
google::protobuf::compiler::CodeGenerator::BuildFeatureSetDefaults
          (StatusOr<google::protobuf::FeatureSetDefaults> *__return_storage_ptr__,
          CodeGenerator *this)

{
  void *pvVar1;
  Metadata MVar2;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions;
  Edition in_stack_ffffffffffffffc8;
  undefined4 uStack_34;
  long local_30;
  long local_28;
  
  MVar2 = FeatureSet::GetMetadata((FeatureSet *)_FeatureSet_default_instance_);
  (*this->_vptr_CodeGenerator[6])(&stack0xffffffffffffffc8,this,MVar2.reflection);
  extensions.ptr_ = (pointer)(local_30 - (long)CONCAT44(uStack_34,in_stack_ffffffffffffffc8) >> 3);
  extensions.len_ = 0x3e6;
  FeatureResolver::CompileDefaults
            (__return_storage_ptr__,(FeatureResolver *)MVar2.descriptor,
             (Descriptor *)CONCAT44(uStack_34,in_stack_ffffffffffffffc8),extensions,EDITION_2024,
             in_stack_ffffffffffffffc8);
  pvVar1 = (void *)CONCAT44(uStack_34,in_stack_ffffffffffffffc8);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_28 - (long)pvVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSetDefaults> CodeGenerator::BuildFeatureSetDefaults()
    const {
  // For generators that don't fully support editions yet, provide an
  // optimistic set of defaults.  Protoc will check this condition later
  // anyway.
  return FeatureResolver::CompileDefaults(
      FeatureSet::descriptor(), GetFeatureExtensions(), ProtocMinimumEdition(),
      MaximumKnownEdition());
}